

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  byte *pbVar1;
  u16 *puVar2;
  uint uVar3;
  Table *pTVar4;
  Column *pCVar5;
  char *zLeft;
  ushort uVar6;
  int iVar7;
  Index *pIVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 == (Table *)0x0) || (pParse->declareVtab != '\0')) goto LAB_00143bb1;
  if ((pTVar4->tabFlags & 4) != 0) {
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar4->zName);
    goto LAB_00143bb1;
  }
  bVar10 = pTVar4->tabFlags | 4;
  pTVar4->tabFlags = bVar10;
  if (pList == (ExprList *)0x0) {
    uVar13 = (int)pTVar4->nCol - 1;
    puVar2 = &pTVar4->aCol[(long)(int)pTVar4->nCol + -1].colFlags;
    *puVar2 = *puVar2 | 1;
LAB_00143b0d:
    if ((((-1 < (int)uVar13) && ((int)uVar13 < (int)pTVar4->nCol)) &&
        (zLeft = pTVar4->aCol[uVar13].zType, zLeft != (char *)0x0)) &&
       (iVar7 = sqlite3_stricmp(zLeft,"INTEGER"), iVar7 == 0 && sortOrder == 0)) {
      pTVar4->iPKey = (i16)uVar13;
      pTVar4->keyConf = (u8)onError;
      pTVar4->tabFlags = bVar10 | (char)autoInc << 3;
      goto LAB_00143bb1;
    }
  }
  else {
    uVar3 = pList->nExpr;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    uVar14 = 0xffffffffffffffff;
    for (uVar12 = 0; uVar13 = (uint)uVar14, uVar12 != uVar9; uVar12 = uVar12 + 1) {
      uVar6 = pTVar4->nCol;
      if ((short)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar14 = (ulong)uVar6;
      lVar15 = 0x2a;
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        pCVar5 = pTVar4->aCol;
        iVar7 = sqlite3_stricmp(pList->a[uVar12].zName,*(char **)((long)pCVar5 + lVar15 + -0x2a));
        if (iVar7 == 0) {
          pbVar1 = (byte *)((long)&pCVar5->zName + lVar15);
          *pbVar1 = *pbVar1 | 1;
          uVar14 = uVar11 & 0xffffffff;
          break;
        }
        lVar15 = lVar15 + 0x30;
      }
    }
    if ((int)uVar3 < 2) goto LAB_00143b0d;
  }
  if (autoInc == 0) {
    pIVar8 = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                                (Token *)0x0,(Token *)0x0,sortOrder,0);
    pList = (ExprList *)0x0;
    if (pIVar8 != (Index *)0x0) {
      pIVar8->field_0x4f = pIVar8->field_0x4f & 0xfc | 2;
      pList = (ExprList *)0x0;
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
  }
LAB_00143bb1:
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  char *zType = 0;
  int iCol = -1, i;
  if( pTab==0 || IN_DECLARE_VTAB ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
  }else{
    for(i=0; i<pList->nExpr; i++){
      for(iCol=0; iCol<pTab->nCol; iCol++){
        if( sqlite3StrICmp(pList->a[i].zName, pTab->aCol[iCol].zName)==0 ){
          break;
        }
      }
      if( iCol<pTab->nCol ){
        pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
      }
    }
    if( pList->nExpr>1 ) iCol = -1;
  }
  if( iCol>=0 && iCol<pTab->nCol ){
    zType = pTab->aCol[iCol].zType;
  }
  if( zType && sqlite3StrICmp(zType, "INTEGER")==0
        && sortOrder==SQLITE_SO_ASC ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    Index *p;
    p = sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0, 0, sortOrder, 0);
    if( p ){
      p->autoIndex = 2;
    }
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}